

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardrtn.c
# Opt level: O2

void incusecount68k(FX *fx68k)

{
  DLword *SAddr;
  ushort uVar1;
  DLword DVar2;
  
  if ((fx68k != (FX *)0x0) && ((FX *)Stackspace != fx68k)) {
    uVar1 = *(short *)&fx68k->field_0x2 + 1;
    fx68k->field_0x2 = (char)uVar1;
    if (200 < (uVar1 & 0xff)) {
      error("MP9324:Stack frame use count maximum exceeded");
    }
    SAddr = Stackspace + fx68k->nextblock;
    uVar1 = *(ushort *)((ulong)SAddr ^ 2) >> 0xd;
    if (uVar1 == 4) {
      if (((*(ushort *)((ulong)(SAddr + 2) ^ 2) & 0xe000) == 0xc000) && ((SAddr[2] & 1) == 0)) {
        DVar2 = StackOffsetFromNative(SAddr);
        SAddr[0xb] = DVar2;
        SAddr[10] = SAddr[2];
        *(byte *)(SAddr + 2) = (byte)SAddr[2] | 1;
      }
    }
    else if (uVar1 == 0) {
      do {
      } while( true );
    }
  }
  return;
}

Assistant:

void incusecount68k(FX *fx68k) {
  StackWord *scanptr68k;

  if (FX_INVALIDP(fx68k)) return;

  CHECK_FX(fx68k);

  if ((++(fx68k->usecount)) > MAXSAFEUSECOUNT)
    error("MP9324:Stack frame use count maximum exceeded");

  scanptr68k = (StackWord *)NativeAligned2FromStackOffset(fx68k->nextblock);
  switch (STKWORD(scanptr68k)->flags) {
    case STK_NOTFLG:
      while (STKWORD(scanptr68k)->flags != STK_BF)
        scanptr68k = (StackWord *)(((DLword *)scanptr68k) + DLWORDSPER_CELL);
      break;

    case STK_BF: break;

    default:
      return;
      /* break; */
  } /* switch end */

  /* DEBUG */
  S_CHECK(
      (((Bframe *)scanptr68k)->residual == T) || (((Bframe *)scanptr68k)->ivar == fx68k->nextblock),
      "BF not residual, and IVER /= nextblock of prior frame");

  scanptr68k = (StackWord *)(((DLword *)scanptr68k) + DLWORDSPER_CELL);

  if (STKWORD(scanptr68k)->flags == STK_FX) {
    CHECK_FX((FX *)scanptr68k);
    SET_FASTP_NIL(scanptr68k);
  }

}